

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9MemObjStore(jx9_value *pSrc,jx9_value *pDest)

{
  int *piVar1;
  uint uVar2;
  sxu32 nSize;
  int iVar3;
  sxi32 sVar4;
  jx9_hashmap *pMap;
  
  if ((pSrc->iFlags & 0x40) != 0) {
    piVar1 = (int *)((pSrc->x).iVal + 0x50);
    *piVar1 = *piVar1 + 1;
  }
  if ((pDest->iFlags & 0x40) == 0) {
    pMap = (jx9_hashmap *)0x0;
  }
  else {
    pMap = (jx9_hashmap *)(pDest->x).pOther;
  }
  SyMemcpy(pSrc,pDest,0x14);
  if ((pSrc->sBlob).nByte == 0) {
    sVar4 = 0;
    if ((pDest->sBlob).nByte != 0) {
      SyBlobRelease(&pDest->sBlob);
    }
  }
  else {
    (pDest->sBlob).nByte = 0;
    uVar2 = (pDest->sBlob).nFlags;
    if ((uVar2 & 4) != 0) {
      (pDest->sBlob).pBlob = (void *)0x0;
      (pDest->sBlob).mByte = 0;
      (pDest->sBlob).nFlags = uVar2 & 0xfffffffb;
    }
    nSize = (pSrc->sBlob).nByte;
    if (nSize == 0) {
      sVar4 = 0;
    }
    else {
      sVar4 = SyBlobAppend(&pDest->sBlob,(pSrc->sBlob).pBlob,nSize);
    }
  }
  if ((pMap != (jx9_hashmap *)0x0) && (iVar3 = pMap->iRef, pMap->iRef = iVar3 + -1, iVar3 < 2)) {
    jx9HashmapRelease(pMap,1);
  }
  return sVar4;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjStore(jx9_value *pSrc, jx9_value *pDest)
{
	jx9_hashmap *pMap = 0;
	sxi32 rc;
	if( pSrc->iFlags & MEMOBJ_HASHMAP ){
		/* Increment reference count */
		((jx9_hashmap *)pSrc->x.pOther)->iRef++;
	}
	if( pDest->iFlags & MEMOBJ_HASHMAP ){
		pMap = (jx9_hashmap *)pDest->x.pOther;
	}
	SyMemcpy((const void *)&(*pSrc), &(*pDest), sizeof(jx9_value)-(sizeof(jx9_vm *)+sizeof(SyBlob)+sizeof(sxu32)));
	rc = SXRET_OK;
	if( SyBlobLength(&pSrc->sBlob) > 0 ){
		SyBlobReset(&pDest->sBlob);
		rc = SyBlobDup(&pSrc->sBlob, &pDest->sBlob);
	}else{
		if( SyBlobLength(&pDest->sBlob) > 0 ){
			SyBlobRelease(&pDest->sBlob);
		}
	}
	if( pMap ){
		jx9HashmapUnref(pMap);
	}
	return rc;
}